

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

int level_range(xchar dgn,int base,int rrand,int chain,proto_dungeon *pd,int *adjusted_base)

{
  uint uVar1;
  int local_44;
  s_level *levtmp;
  int lmax;
  int *adjusted_base_local;
  proto_dungeon *pd_local;
  int chain_local;
  int rrand_local;
  int base_local;
  xchar dgn_local;
  
  uVar1 = (uint)dungeons[dgn].num_dunlevs;
  if (chain < 0) {
    chain_local = base;
    if (base < 0) {
      chain_local = uVar1 + base + 1;
    }
  }
  else {
    if (pd->final_lev[chain] == (s_level *)0x0) {
      panic("level_range: empty chain level!");
    }
    chain_local = (pd->final_lev[chain]->dlevel).dlevel + base;
  }
  if ((0 < chain_local) && (chain_local <= (int)uVar1)) {
    *adjusted_base = chain_local;
    if (rrand == -1) {
      base_local = (uVar1 - chain_local) + 1;
    }
    else if (rrand == 0) {
      base_local = 1;
    }
    else {
      local_44 = rrand;
      if ((int)uVar1 < chain_local + rrand + -1) {
        local_44 = (uVar1 - chain_local) + 1;
      }
      base_local = local_44;
    }
    return base_local;
  }
  panic("level_range: base value out of range. base: %d, lmax: %d",(ulong)(uint)chain_local,
        (ulong)uVar1);
}

Assistant:

static int level_range(xchar dgn, int base, int rrand, int chain,
		       struct proto_dungeon *pd, int *adjusted_base)
{
	int lmax = dungeons[dgn].num_dunlevs;

	if (chain >= 0) {		 /* relative to a special level */
	    s_level *levtmp = pd->final_lev[chain];
	    if (!levtmp) panic("level_range: empty chain level!");

	    base += levtmp->dlevel.dlevel;
	} else {			/* absolute in the dungeon */
	    /* from end of dungeon */
	    if (base < 0) base = (lmax + base + 1);
	}

	if (base < 1 || base > lmax)
	    panic("level_range: base value out of range. base: %d, lmax: %d", base, lmax);

	*adjusted_base = base;

	if (rrand == -1) {	/* from base to end of dungeon */
	    return lmax - base + 1;
	} else if (rrand) {
	    /* make sure we don't run off the end of the dungeon */
	    return ((base + rrand - 1) > lmax) ? lmax-base+1 : rrand;
	} /* else only one choice */
	return 1;
}